

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::LiteralString::LiteralString
          (LiteralString *this,LocationRange *lr,Fodder *open_fodder,UString *value,
          TokenKind token_kind,string *block_indent,string *block_term_indent)

{
  AST *in_RCX;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDX;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  string *in_R9;
  string *in_stack_00000008;
  Fodder *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  AST::AST(in_RCX,(LocationRange *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
           (ASTType)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__LiteralString_003a1d20;
  std::__cxx11::u32string::u32string(in_RSI,in_RDX);
  *(undefined4 *)(in_RDI + 0x14) = in_R8D;
  std::__cxx11::string::string((string *)(in_RDI + 0x15),in_R9);
  std::__cxx11::string::string((string *)(in_RDI + 0x19),in_stack_00000008);
  return;
}

Assistant:

LiteralString(const LocationRange &lr, const Fodder &open_fodder, const UString &value,
                  TokenKind token_kind, const std::string &block_indent,
                  const std::string &block_term_indent)
        : AST(lr, AST_LITERAL_STRING, open_fodder),
          value(value),
          tokenKind(token_kind),
          blockIndent(block_indent),
          blockTermIndent(block_term_indent)
    {
    }